

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forwarder_test.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool internal;
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  value *this;
  ostream *poVar4;
  service srv;
  thread fw_thread;
  forwarder fw;
  undefined1 local_30 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  __shared_ptr<cppcms::service,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  cppcms::service::service(&srv,argc,argv);
  uVar2 = cppcms::service::applications_pool();
  cppcms::create_pool<unit_test>();
  cppcms::applications_pool::mount(uVar2,local_30,0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28);
  pcVar3 = (char *)cppcms::service::settings();
  cppcms::json::value::find(pcVar3);
  iVar1 = cppcms::json::value::type();
  if (iVar1 == 4) {
    fw.srv.super___shared_ptr<cppcms::service,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    fw.app_.p_ = (application *)std::_Function_handler<void_(),_submitter>::_M_manager;
    fw.srv.super___shared_ptr<cppcms::service,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&srv;
    cppcms::service::after_fork((function *)&srv);
    std::_Function_base::~_Function_base((_Function_base *)&fw);
  }
  this = (value *)cppcms::service::settings();
  internal = cppcms::json::value::get<bool>(this,"test.internal");
  forwarder::forwarder(&fw,internal);
  std::thread::thread<forwarder&,,void>(&fw_thread,&fw);
  cppcms::service::run();
  std::__shared_ptr<cppcms::service,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_20,(__shared_ptr<cppcms::service,_(__gnu_cxx::_Lock_policy)2> *)&fw);
  cppcms::service::shutdown();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  std::thread::join();
  std::thread::~thread(&fw_thread);
  forwarder::~forwarder(&fw);
  cppcms::service::~service(&srv);
  if ((run_ok == false) || (fw_ok != true)) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Failed run=");
    poVar4 = std::ostream::_M_insert<bool>(SUB81(poVar4,0));
    poVar4 = std::operator<<(poVar4," forwarder=");
    poVar4 = std::ostream::_M_insert<bool>(SUB81(poVar4,0));
    std::endl<char,std::char_traits<char>>(poVar4);
    iVar1 = 1;
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cout,"Done Ok");
    std::endl<char,std::char_traits<char>>(poVar4);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int main(int argc,char **argv) 
{
	try {
		cppcms::service srv(argc,argv);
		srv.applications_pool().mount( cppcms::create_pool<unit_test>());
		if(srv.settings().find("test.exec").type()==cppcms::json::is_string)
			srv.after_fork(submitter(srv));
	
		bool internal=srv.settings().get<bool>("test.internal");	
		forwarder fw(internal);
		booster::thread fw_thread(fw);
		
		srv.run();
		fw.service()->shutdown();
		fw_thread.join();
	}
	catch(std::exception const &e) {
		std::cerr << e.what() << std::endl;
		return EXIT_FAILURE;
	}
	if(run_ok  && fw_ok) {
		std::cout << "Done Ok" << std::endl;
		return EXIT_SUCCESS;
	}
	else {
		std::cerr << "Failed run=" << run_ok << " forwarder=" << fw_ok << std::endl;
		return EXIT_FAILURE;
	}
}